

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O1

double TasGrid::RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                 (int max_order,int point,double x,bool *isSupported)

{
  double dVar1;
  
  *isSupported = true;
  if (point == 0) {
    dVar1 = 1.0;
  }
  else {
    dVar1 = scaleX<(TasGrid::RuleLocal::erule)1>(point,x);
    if (ABS(dVar1) <= 1.0) {
      if (max_order == 3) {
        dVar1 = evalPWCubic<(TasGrid::RuleLocal::erule)1>(point,dVar1);
        return dVar1;
      }
      if (max_order == 2) {
        if (point == 2) {
          dVar1 = dVar1 + 1.0;
        }
        else if (point == 1) {
          dVar1 = 1.0 - dVar1;
        }
        else {
          dVar1 = (dVar1 + 1.0) * (1.0 - dVar1);
        }
      }
      else {
        if (max_order != 1) {
          dVar1 = evalPWPower<(TasGrid::RuleLocal::erule)1>(max_order,point,dVar1);
          return dVar1;
        }
        dVar1 = 1.0 - ABS(dVar1);
      }
    }
    else {
      *isSupported = false;
      dVar1 = 0.0;
    }
  }
  return dVar1;
}

Assistant:

double evalSupport(int max_order, int point, double x, bool &isSupported) {
        switch(effective_rule) {
            case erule::pwc: {
                    double distance = std::abs(x - getNode<effective_rule>(point));
                    double support  = getSupport<effective_rule>(point);
                    isSupported = (distance <= 2.0 * support);
                    return (distance <= support) ? 1.0 : 0.0;
                }
            case erule::localp:
                isSupported = true;
                if (point == 0) {
                    return 1.0;
                } else {
                    double xn = scaleX<effective_rule>(point, x);
                    if (std::abs(xn) <= 1.0) {
                        switch(max_order) {
                            case 1: return 1.0 - std::abs(xn);
                            case 2: return evalPWQuadratic<effective_rule>(point, xn);
                            case 3: return evalPWCubic<effective_rule>(point, xn);
                            default:
                                return evalPWPower<effective_rule>(max_order, point, xn);
                        };
                    } else {
                        isSupported = false;
                        return 0.0;
                    }
                }
            case erule::semilocalp:
                isSupported = true;
                switch(point) {
                    case 0: return 1.0;
                    case 1: return 0.5 * x * (x - 1.0);
                    case 2: return 0.5 * x * (x + 1.0);
                    default: {
                        double xn = scaleX<effective_rule>(point, x);
                        if (std::abs(xn) <= 1.0) {
                            switch(max_order) {
                                case 1: return 1.0 - std::abs(xn);
                                case 2: return evalPWQuadratic<effective_rule>(point, xn);
                                case 3: return evalPWCubic<effective_rule>(point, xn);
                                default:
                                    return evalPWPower<effective_rule>(max_order, point, xn);
                            };
                        } else {
                            isSupported = false;
                            return 0.0;
                        }
                    }
                };
            case erule::localp0:
            default: { // case erule::localpb:
                    double xn = scaleX<effective_rule>(point, x);
                    if (std::abs(xn) <= 1.0) {
                        isSupported = true;
                        switch(max_order) {
                            case 1: return 1.0 - std::abs(xn);
                            case 2: return evalPWQuadratic<effective_rule>(point, xn);
                            case 3: return evalPWCubic<effective_rule>(point, xn);
                            default:
                                return evalPWPower<effective_rule>(max_order, point, xn);
                        };
                    } else {
                        isSupported = false;
                        return 0.0;
                    }
                }
        };
    }